

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcher.cpp
# Opt level: O3

void __thiscall Kernel::MLMatcher::Impl::Impl(Impl *this)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  TermList *p;
  Literal **__s;
  List<Kernel::Literal_*> **__s_00;
  uint *puVar4;
  uint **__s_01;
  TermList ***__s_02;
  pair<int,_int> **__s_03;
  TermList **__s_04;
  TermList *pTVar5;
  pair<int,_int> *__s_05;
  long lVar6;
  ulong uVar7;
  Literal **res;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  (this->s_baseLits)._size = 0x20;
  (this->s_baseLits)._capacity = 0x20;
  __s = (Literal **)::operator_new(0x100,0x10);
  sVar1 = (this->s_baseLits)._capacity;
  if (sVar1 != 0) {
    memset(__s,0,sVar1 << 3);
  }
  (this->s_baseLits)._array = __s;
  (this->s_altsArr)._size = 0x20;
  (this->s_altsArr)._capacity = 0x20;
  __s_00 = (List<Kernel::Literal_*> **)::operator_new(0x100,0x10);
  sVar1 = (this->s_altsArr)._capacity;
  if (sVar1 != 0) {
    memset(__s_00,0,sVar1 << 3);
  }
  (this->s_altsArr)._array = __s_00;
  (this->s_varCnts)._size = 0x20;
  (this->s_varCnts)._capacity = 0x20;
  puVar4 = (uint *)::operator_new(0x80,0x10);
  sVar1 = (this->s_varCnts)._capacity;
  if (sVar1 != 0) {
    memset(puVar4,0,sVar1 << 2);
  }
  (this->s_varCnts)._array = puVar4;
  (this->s_boundVarNums)._size = 0x20;
  (this->s_boundVarNums)._capacity = 0x20;
  __s_01 = (uint **)::operator_new(0x100,0x10);
  sVar1 = (this->s_boundVarNums)._capacity;
  if (sVar1 != 0) {
    memset(__s_01,0,sVar1 << 3);
  }
  (this->s_boundVarNums)._array = __s_01;
  (this->s_altPtrs)._size = 0x20;
  (this->s_altPtrs)._capacity = 0x20;
  __s_02 = (TermList ***)::operator_new(0x100,0x10);
  sVar1 = (this->s_altPtrs)._capacity;
  if (sVar1 != 0) {
    memset(__s_02,0,sVar1 << 3);
  }
  (this->s_altPtrs)._array = __s_02;
  (this->s_remaining)._2sideMinus1 = 0x3f;
  (this->s_remaining)._data = (uint *)0x0;
  (this->s_remaining)._capacity = 0x210;
  puVar4 = (uint *)::operator_new(0x840,0x10);
  sVar1 = (this->s_remaining)._capacity;
  if (sVar1 != 0) {
    memset(puVar4,0,sVar1 << 2);
  }
  (this->s_remaining)._data = puVar4;
  (this->s_intersections)._2sideMinus1 = 0x3f;
  (this->s_intersections)._data = (pair<int,_int> **)0x0;
  (this->s_intersections)._capacity = 0x210;
  __s_03 = (pair<int,_int> **)::operator_new(0x1080,0x10);
  sVar1 = (this->s_intersections)._capacity;
  if (sVar1 != 0) {
    memset(__s_03,0,sVar1 << 3);
  }
  (this->s_intersections)._data = __s_03;
  (this->s_nextAlts)._size = 0x20;
  (this->s_nextAlts)._capacity = 0x20;
  puVar4 = (uint *)::operator_new(0x80,0x10);
  sVar1 = (this->s_nextAlts)._capacity;
  if (sVar1 != 0) {
    memset(puVar4,0,sVar1 << 2);
  }
  (this->s_nextAlts)._array = puVar4;
  (this->s_boundVarNumData)._size = 0x40;
  (this->s_boundVarNumData)._capacity = 0x40;
  puVar4 = (uint *)::operator_new(0x100,0x10);
  sVar1 = (this->s_boundVarNumData)._capacity;
  if (sVar1 != 0) {
    memset(puVar4,0,sVar1 << 2);
  }
  (this->s_boundVarNumData)._array = puVar4;
  (this->s_altBindingPtrs)._size = 0x80;
  (this->s_altBindingPtrs)._capacity = 0x80;
  __s_04 = (TermList **)::operator_new(0x400,0x10);
  sVar1 = (this->s_altBindingPtrs)._capacity;
  if (sVar1 != 0) {
    memset(__s_04,0,sVar1 << 3);
  }
  (this->s_altBindingPtrs)._array = __s_04;
  (this->s_altBindingsData)._size = 0x100;
  (this->s_altBindingsData)._capacity = 0x100;
  pTVar5 = (TermList *)::operator_new(0x800,0x10);
  auVar3 = _DAT_0084f040;
  auVar2 = _DAT_0084f030;
  sVar1 = (this->s_altBindingsData)._capacity;
  if (sVar1 != 0) {
    lVar6 = sVar1 - 1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_0084f040;
    do {
      auVar9._8_4_ = (int)uVar7;
      auVar9._0_8_ = uVar7;
      auVar9._12_4_ = (int)(uVar7 >> 0x20);
      auVar9 = (auVar9 | auVar2) ^ auVar3;
      if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                  auVar8._4_4_ < auVar9._4_4_) & 1)) {
        pTVar5[uVar7]._content = 2;
      }
      if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
          auVar9._12_4_ <= auVar8._12_4_) {
        pTVar5[uVar7 + 1]._content = 2;
      }
      uVar7 = uVar7 + 2;
    } while ((sVar1 + 1 & 0xfffffffffffffffe) != uVar7);
  }
  (this->s_altBindingsData)._array = pTVar5;
  (this->s_intersectionData)._size = 0x80;
  (this->s_intersectionData)._capacity = 0x80;
  __s_05 = (pair<int,_int> *)::operator_new(0x400,0x10);
  sVar1 = (this->s_intersectionData)._capacity;
  if (sVar1 != 0) {
    memset(__s_05,0,sVar1 << 3);
  }
  (this->s_intersectionData)._array = __s_05;
  (this->s_matchRecord)._size = 0x20;
  (this->s_matchRecord)._capacity = 0x20;
  puVar4 = (uint *)::operator_new(0x80,0x10);
  sVar1 = (this->s_matchRecord)._capacity;
  if (sVar1 != 0) {
    memset(puVar4,0,sVar1 << 2);
  }
  (this->s_matchRecord)._array = puVar4;
  (this->stats).numDecisions = 0;
  (this->stats).result = false;
  return;
}

Assistant:

MLMatcher::Impl::Impl()
  : s_baseLits(32)
  , s_altsArr(32)
  , s_varCnts(32)
  , s_boundVarNums(32)
  , s_altPtrs(32)
  , s_remaining(32)
  , s_intersections(32)
  , s_nextAlts(32)
  , s_boundVarNumData(64)
  , s_altBindingPtrs(128)
  , s_altBindingsData(256)
  , s_intersectionData(128)
  , s_matchRecord(32)
{ }